

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeNF
          (ChElementHexaANCF_3813 *this,double U,double V,double W,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  char *__function;
  long lVar16;
  double *pdVar17;
  Index index;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar45 [64];
  double dVar46;
  undefined1 in_register_00001248 [56];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ShapeVector N;
  double local_c0 [12];
  undefined1 local_60 [16];
  
  auVar49._8_56_ = in_register_00001288;
  auVar49._0_8_ = W;
  auVar47._8_56_ = in_register_00001248;
  auVar47._0_8_ = V;
  auVar45._8_56_ = in_register_00001208;
  auVar45._0_8_ = U;
  auVar27 = ZEXT816(0x3ff0000000000000);
  dVar14 = 1.0 - U;
  auVar20 = vsubsd_avx512f(auVar27,auVar47._0_16_);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar14 * 0.125;
  auVar21 = vmulsd_avx512f(auVar28,auVar20);
  dVar15 = 1.0 - W;
  local_c0[0] = dVar15 * auVar21._0_8_;
  auVar22 = vaddsd_avx512f(auVar45._0_16_,auVar27);
  auVar23 = vmulsd_avx512f(auVar22,ZEXT816(0x3fc0000000000000));
  auVar24 = vmulsd_avx512f(auVar23,auVar20);
  local_c0[1] = dVar15 * auVar24._0_8_;
  auVar25 = vaddsd_avx512f(auVar47._0_16_,auVar27);
  auVar23 = vmulsd_avx512f(auVar23,auVar25);
  local_c0[2] = dVar15 * auVar23._0_8_;
  auVar26 = vmulsd_avx512f(auVar28,auVar25);
  local_c0[3] = dVar15 * auVar26._0_8_;
  auVar27 = vaddsd_avx512f(auVar49._0_16_,auVar27);
  auVar21 = vmulsd_avx512f(auVar21,auVar27);
  local_c0[4] = (double)auVar21._0_8_;
  auVar21 = vmulsd_avx512f(auVar24,auVar27);
  local_c0[5] = (double)auVar21._0_8_;
  auVar21 = vmulsd_avx512f(auVar23,auVar27);
  local_c0[6] = (double)auVar21._0_8_;
  auVar21 = vmulsd_avx512f(auVar26,auVar27);
  local_c0[7] = (double)auVar21._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (this->m_InertFlexVec).m_data[1];
  auVar21 = vdivsd_avx512f(ZEXT816(0x4000000000000000),auVar21);
  dVar12 = auVar21._0_8_ * 0.125;
  dVar13 = dVar14 * dVar12;
  auVar54._8_8_ = 0x8000000000000000;
  auVar54._0_8_ = 0x8000000000000000;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar13;
  auVar48._0_8_ = -dVar13;
  auVar48._8_8_ = 0x8000000000000000;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar12;
  auVar26 = vmulsd_avx512f(auVar22,auVar24);
  auVar50._0_8_ = -auVar26._0_8_;
  auVar50._8_8_ = auVar26._8_8_ ^ 0x8000000000000000;
  auVar28 = vmulsd_avx512f(auVar27,auVar48);
  auVar29 = vmulsd_avx512f(auVar27,auVar50);
  auVar30 = vmulsd_avx512f(auVar27,auVar26);
  auVar31 = vmulsd_avx512f(auVar27,auVar31);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (this->m_InertFlexVec).m_data[2];
  auVar21 = vdivsd_avx512f(ZEXT816(0x4000000000000000),auVar23);
  dVar12 = auVar21._0_8_ * 0.125;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar14 * dVar12;
  auVar32 = vmulsd_avx512f(auVar20,auVar35);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar12;
  auVar21 = vmulsd_avx512f(auVar22,auVar34);
  local_60 = vmulsd_avx512f(auVar20,auVar21);
  dVar46 = local_60._0_8_;
  auVar55._8_8_ = dVar46;
  auVar55._0_8_ = dVar46;
  auVar33 = vmulsd_avx512f(auVar25,auVar21);
  auVar34 = vmulsd_avx512f(auVar25,auVar35);
  auVar35 = vmovddup_avx512vl(auVar34);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (this->m_InertFlexVec).m_data[0];
  auVar21 = vdivsd_avx512f(ZEXT816(0x4000000000000000),auVar22);
  auVar21 = vmulsd_avx512f(auVar21,ZEXT816(0x3fc0000000000000));
  auVar23 = vxorpd_avx512vl(auVar21,auVar54);
  auVar22 = vmulsd_avx512f(auVar25,auVar23);
  auVar36 = vmulsd_avx512f(auVar27,auVar22);
  auVar24 = vmulsd_avx512f(auVar25,auVar21);
  auVar25 = vmulsd_avx512f(auVar27,auVar24);
  auVar21 = vmulsd_avx512f(auVar20,auVar21);
  auVar37 = vmulsd_avx512f(auVar27,auVar21);
  auVar23 = vmulsd_avx512f(auVar20,auVar23);
  auVar27 = vmulsd_avx512f(auVar27,auVar23);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar15;
  auVar38 = vmulsd_avx512f(auVar42,auVar22);
  auVar39 = vmulsd_avx512f(auVar42,auVar24);
  auVar40 = vmulsd_avx512f(auVar42,auVar21);
  auVar41 = vmulsd_avx512f(auVar42,auVar23);
  auVar21 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xc);
  auVar42 = vmovddup_avx512vl(auVar27);
  auVar23 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 9);
  auVar22 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 6);
  auVar20 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 3);
  auVar43 = vmovddup_avx512vl(auVar40);
  auVar24 = *(undefined1 (*) [16])
             (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
             m_data.array;
  auVar44 = vmovddup_avx512vl(auVar41);
  auVar44 = vmulpd_avx512vl(auVar44,auVar24);
  auVar43 = vfmadd231pd_avx512vl(auVar44,auVar20,auVar43);
  auVar44 = vmovddup_avx512vl(auVar39);
  auVar43 = vfmadd231pd_avx512vl(auVar43,auVar22,auVar44);
  auVar44 = vmovddup_avx512vl(auVar38);
  auVar43 = vfmadd231pd_avx512vl(auVar43,auVar23,auVar44);
  auVar42 = vfmadd231pd_avx512vl(auVar43,auVar21,auVar42);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar15 * auVar50._0_8_;
  auVar43 = vmovddup_avx512vl(auVar53);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar15 * auVar48._0_8_;
  auVar44 = vmovddup_avx512vl(auVar51);
  auVar44 = vmulpd_avx512vl(auVar44,auVar24);
  auVar43 = vfmadd231pd_avx512vl(auVar44,auVar20,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar15 * auVar26._0_8_;
  auVar26 = vmovddup_avx512vl(auVar44);
  auVar26 = vfmadd231pd_avx512vl(auVar43,auVar22,auVar26);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar15 * dVar13;
  auVar43 = vmovddup_avx512vl(auVar52);
  auVar26 = vfmadd231pd_avx512vl(auVar26,auVar23,auVar43);
  auVar43 = vmovddup_avx512vl(auVar28);
  auVar26 = vfmadd231pd_avx512vl(auVar26,auVar21,auVar43);
  auVar43 = vmovddup_avx512vl(auVar32);
  auVar24 = vmulpd_avx512vl(auVar43,auVar24);
  auVar20 = vfnmsub231pd_avx512vl(auVar24,auVar55,auVar20);
  auVar24 = vmovddup_avx512vl(auVar33);
  auVar20 = vfnmadd231pd_avx512vl(auVar20,auVar24,auVar22);
  auVar22 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x15);
  auVar20 = vfnmadd231pd_avx512vl(auVar20,auVar35,auVar23);
  auVar23 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0x12);
  auVar20 = vfmadd231pd_avx512vl(auVar20,auVar21,auVar43);
  auVar21 = *(undefined1 (*) [16])
             ((this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
              m_data.array + 0xf);
  auVar43 = vmovddup_avx512vl(auVar37);
  auVar42 = vfmadd231pd_avx512vl(auVar42,auVar21,auVar43);
  auVar43 = vmovddup_avx512vl(auVar25);
  auVar42 = vfmadd231pd_avx512vl(auVar42,auVar23,auVar43);
  auVar43 = vmovddup_avx512vl(auVar36);
  auVar42 = vfmadd231pd_avx512vl(auVar42,auVar22,auVar43);
  dVar12 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[2];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar12;
  auVar41 = vmulsd_avx512f(auVar41,auVar58);
  dVar14 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.
           m_data.array[5];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar14;
  auVar40 = vmulsd_avx512f(auVar40,auVar43);
  auVar40 = vaddsd_avx512f(auVar41,auVar40);
  dVar2 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[8];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar2;
  auVar39 = vmulsd_avx512f(auVar39,auVar57);
  dVar3 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0xb];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar3;
  auVar38 = vmulsd_avx512f(auVar38,auVar41);
  auVar38 = vaddsd_avx512f(auVar39,auVar38);
  auVar38 = vaddsd_avx512f(auVar40,auVar38);
  auVar39 = vmovddup_avx512vl(auVar29);
  auVar26 = vfmadd231pd_avx512vl(auVar26,auVar21,auVar39);
  auVar39 = vmovddup_avx512vl(auVar30);
  auVar26 = vfmadd231pd_avx512vl(auVar26,auVar23,auVar39);
  auVar21 = vfmadd231pd_avx512vl(auVar20,auVar21,auVar55);
  auVar21 = vfmadd231pd_avx512vl(auVar21,auVar23,auVar24);
  dVar4 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0xe];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar4;
  auVar23 = vmulsd_avx512f(auVar27,auVar40);
  dVar5 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0x11];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar5;
  auVar20 = vmulsd_avx512f(auVar37,auVar56);
  auVar23 = vaddsd_avx512f(auVar23,auVar20);
  auVar20 = vmovddup_avx512vl(auVar31);
  auVar24 = vfmadd231pd_avx512vl(auVar26,auVar22,auVar20);
  auVar26 = vxorpd_avx512vl(auVar35,auVar54);
  auVar27 = vfmadd231pd_avx512vl(auVar21,auVar22,auVar35);
  dVar6 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0x14];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar6;
  auVar21 = vmulsd_avx512f(auVar25,auVar37);
  dVar7 = (this->m_d0).super_PlainObjectBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>.m_storage.m_data
          .array[0x17];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar7;
  auVar22 = vmulsd_avx512f(auVar36,auVar39);
  auVar21 = vaddsd_avx512f(auVar21,auVar22);
  auVar21 = vaddsd_avx512f(auVar23,auVar21);
  auVar25 = vaddsd_avx512f(auVar38,auVar21);
  auVar21 = vmulsd_avx512f(auVar51,auVar58);
  auVar23 = vmulsd_avx512f(auVar44,auVar57);
  auVar22 = vmulsd_avx512f(auVar28,auVar40);
  auVar20 = vmulsd_avx512f(auVar29,auVar56);
  auVar28 = vmulsd_avx512f(auVar30,auVar37);
  auVar29 = vmulsd_avx512f(auVar31,auVar39);
  dVar13 = auVar21._0_8_ + dVar15 * auVar50._0_8_ * dVar14 + auVar23._0_8_ + dVar15 * dVar13 * dVar3
           + auVar20._0_8_ + auVar22._0_8_ + auVar28._0_8_ + auVar29._0_8_;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar12;
  auVar23 = vmulsd_avx512f(auVar32,auVar59);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar2;
  auVar22 = vmulsd_avx512f(auVar33,auVar38);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar4;
  auVar28 = vmulsd_avx512f(auVar32,auVar36);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar46;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar5;
  auVar20 = vmulsd_avx512f(auVar32,auVar20);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar6;
  auVar29 = vmulsd_avx512f(auVar33,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar7;
  auVar30 = vmulsd_avx512f(auVar34,auVar30);
  auVar21 = vshufpd_avx(auVar42,auVar42,1);
  auVar31 = vshufpd_avx512vl(auVar24,auVar24,1);
  auVar32 = vshufpd_avx512vl(auVar27,auVar27,1);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (-dVar46 * dVar14 - auVar23._0_8_) + (auVar26._0_8_ * dVar3 - auVar22._0_8_) +
       auVar28._0_8_ + auVar20._0_8_ + auVar29._0_8_ + auVar30._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar13 * auVar32._0_8_;
  auVar23 = vfmsub231sd_fma(auVar26,auVar31,auVar33);
  auVar22 = vmulsd_avx512f(auVar25,auVar32);
  auVar22 = vfmsub231sd_fma(auVar22,auVar21,auVar33);
  auVar20 = vmulsd_avx512f(auVar25,auVar31);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar13;
  auVar21 = vfmsub231sd_fma(auVar20,auVar21,auVar25);
  auVar22 = vmulsd_avx512f(auVar24,auVar22);
  auVar21 = vmulsd_avx512f(auVar27,auVar21);
  dVar12 = auVar21._0_8_ + (auVar42._0_8_ * auVar23._0_8_ - auVar22._0_8_);
  *detJ = dVar12;
  *detJ = (this->m_InertFlexVec).m_data[0] * (this->m_InertFlexVec).m_data[1] *
          (this->m_InertFlexVec).m_data[2] * 0.125 * dVar12;
  pdVar8 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar9 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  pdVar10 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  lVar11 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  lVar16 = 0;
  pdVar17 = pdVar10;
  do {
    if (lVar9 < 3) {
      __function = 
      "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
LAB_006e4721:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
    }
    if (lVar11 + -3 < lVar16 * 3) {
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_006e4721;
    }
    pdVar1 = pdVar10 + lVar16 * 3;
    uVar18 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar18 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), 2 < uVar18)) {
      uVar18 = 3;
    }
    dVar12 = local_c0[lVar16];
    if (uVar18 != 0) {
      uVar19 = 0;
      do {
        pdVar17[uVar19] = dVar12 * pdVar8[uVar19];
        uVar19 = uVar19 + 1;
      } while (uVar18 != uVar19);
    }
    if (uVar18 < 3) {
      do {
        pdVar17[uVar18] = dVar12 * pdVar8[uVar18];
        uVar18 = uVar18 + 1;
      } while (uVar18 != 3);
    }
    lVar16 = lVar16 + 1;
    pdVar17 = pdVar17 + 3;
    if (lVar16 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void ChElementHexaANCF_3813::ComputeNF(
    const double U,              // parametric coordinate in volume
    const double V,              // parametric coordinate in volume
    const double W,              // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // this->ComputeNF(U, V, Qi, detJ, F, state_x, state_w);
    ShapeVector N;
    ShapeVector Nx;
    ShapeVector Ny;
    ShapeVector Nz;
    ShapeFunctions(N, U, V, W);  // evaluate shape functions (in compressed vector)
    ShapeFunctionsDerivativeX(Nx, U, V, W);
    ShapeFunctionsDerivativeY(Ny, U, V, W);
    ShapeFunctionsDerivativeZ(Nz, U, V, W);

    ChMatrixNM<double, 3, 3> rd0;
    rd0.col(0) = m_d0.transpose() * Nx.transpose();
    rd0.col(1) = m_d0.transpose() * Ny.transpose();
    rd0.col(2) = m_d0.transpose() * Nz.transpose();
    detJ = rd0.determinant();
    detJ *= this->GetLengthX() * this->GetLengthY() * this->GetLengthZ() / 8.0;

    for (int i = 0; i < 8; i++) {
        Qi.segment(3 * i, 3) = N(i) * F.segment(0, 3);
    }
}